

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.hpp
# Opt level: O3

int __thiscall lattice::supercell::init(supercell *this,EVP_PKEY_CTX *ctx)

{
  span_t *this_00;
  offset_t *this_01;
  offset_t *this_02;
  long *plVar1;
  long *plVar2;
  long *plVar3;
  iterator __position;
  undefined1 auVar4 [16];
  bool bVar5;
  Index dstRows;
  ulong uVar6;
  size_t sVar7;
  pointer puVar8;
  logic_error *this_03;
  undefined8 *puVar9;
  size_t cols;
  pointer puVar10;
  long lVar11;
  code *pcVar12;
  ulong uVar13;
  size_type __new_size;
  undefined *puVar14;
  ulong uVar15;
  long *plVar16;
  ulong uVar17;
  long lVar18;
  long *plVar19;
  ActualDstType actualDst_1;
  ActualDstType actualDst_2;
  Scalar SVar20;
  offset_t c;
  unsigned_long local_50;
  span_t *local_48;
  offset_t *local_38;
  
  this_00 = &this->span_;
  lVar18 = *(long *)ctx;
  sVar7 = *(size_t *)(ctx + 8);
  cols = *(size_t *)(ctx + 0x10);
  if (((this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       != sVar7) ||
     ((this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.m_cols
      != cols)) {
    if ((cols != 0 && sVar7 != 0) &&
       (auVar4 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar4 / SEXT816((long)cols),0) < (long)sVar7)) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(8,ctx,SUB168(auVar4 % SEXT816((long)cols),0));
      *puVar9 = dup2;
      __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<long,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<long,__1,__1,__1,_0> *)this_00,cols * sVar7,sVar7,cols);
    sVar7 = (this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows;
    cols = (this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
  }
  if (0 < (long)(sVar7 * cols)) {
    plVar1 = (this_00->super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar11 = 0;
    do {
      plVar1[lVar11] = *(long *)(lVar18 + lVar11 * 8);
      lVar11 = lVar11 + 1;
    } while (sVar7 * cols - lVar11 != 0);
    sVar7 = (this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows;
    cols = (this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
  }
  if (cols == sVar7) {
    this->dim_ = sVar7;
    local_48 = this_00;
    SVar20 = Eigen::
             MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>_>_>
             ::determinant((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,__1,_0,__1,__1>_>_>
                            *)&stack0xffffffffffffffb8);
    uVar6 = (ulong)(ABS(SVar20) + 0.5);
    this->num_cells_ =
         (long)((ABS(SVar20) + 0.5) - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6;
    local_48 = this_00;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Inverse<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&this->rs_,(SrcXprType *)&stack0xffffffffffffffb8,(assign_op<double,_double> *)&local_50);
    sVar7 = this->dim_;
    this_01 = &this->nmin_;
    if ((this->nmin_).super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        != sVar7) {
      Eigen::PlainObjectBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::resize
                (&this_01->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,sVar7,1);
      sVar7 = (this->nmin_).super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
    }
    if (0 < (long)sVar7) {
      memset((this_01->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,sVar7 << 3);
    }
    sVar7 = this->dim_;
    this_02 = &this->nmax_;
    local_38 = this_01;
    if ((this->nmax_).super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        != sVar7) {
      Eigen::PlainObjectBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::resize
                (&this_02->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,sVar7,1);
      sVar7 = (this->nmax_).super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
    }
    if (0 < (long)sVar7) {
      memset((this_02->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,sVar7 << 3);
    }
    uVar6 = this->dim_;
    plVar1 = (this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
    plVar2 = (this->nmin_).super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    plVar3 = (this->nmax_).super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar15 = 0;
    __new_size = 1;
    do {
      if (uVar6 == 0) goto LAB_0011a18e;
      uVar17 = 0;
      plVar16 = plVar1;
      do {
        uVar13 = 0;
        lVar18 = 0;
        plVar19 = plVar16;
        do {
          if ((uVar15 >> (uVar13 & 0x3f) & 1) == 0) {
            lVar11 = 0;
          }
          else {
            lVar11 = *plVar19;
          }
          lVar18 = lVar18 + lVar11;
          uVar13 = uVar13 + 1;
          plVar19 = plVar19 + (this->span_).
                              super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.
                              m_storage.m_rows;
        } while (uVar6 != uVar13);
        lVar11 = plVar2[uVar17];
        if (lVar18 < lVar11) {
          lVar11 = lVar18;
        }
        plVar2[uVar17] = lVar11;
        lVar11 = plVar3[uVar17];
        if (lVar18 < lVar11) {
          lVar18 = lVar11;
        }
        plVar3[uVar17] = lVar18;
        uVar17 = uVar17 + 1;
        uVar6 = this->dim_;
        plVar16 = plVar16 + 1;
      } while (uVar17 < uVar6);
      uVar15 = uVar15 + 1;
    } while (uVar15 < (ulong)(long)(1 << ((byte)uVar6 & 0x1f)));
    if (uVar6 != 0) {
      __new_size = 1;
      uVar15 = 0;
      do {
        __new_size = __new_size *
                     ((this_02->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data[uVar15] -
                     (local_38->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data[uVar15]);
        uVar15 = uVar15 + 1;
      } while (uVar6 != uVar15);
    }
LAB_0011a18e:
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->lcord2index_,__new_size);
    puVar8 = (this->index2lcord_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->index2lcord_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar8) {
      (this->index2lcord_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish = puVar8;
    }
    local_50 = 0;
    puVar10 = puVar8;
    if ((this->lcord2index_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (this->lcord2index_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      do {
        lcord2offset((supercell *)&stack0xffffffffffffffb8,(size_t)this);
        bVar5 = within_supercell(this,(offset_t *)&stack0xffffffffffffffb8);
        if (bVar5) {
          __position._M_current =
               (this->index2lcord_).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          (this->lcord2index_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[local_50] =
               (long)__position._M_current -
               (long)(this->index2lcord_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
          if (__position._M_current ==
              (this->index2lcord_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->index2lcord_,
                       __position,&local_50);
          }
          else {
            *__position._M_current = local_50;
            (this->index2lcord_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        free(local_48);
        local_50 = local_50 + 1;
      } while (local_50 <
               (ulong)((long)(this->lcord2index_).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->lcord2index_).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3));
      puVar8 = (this->index2lcord_).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar10 = (this->index2lcord_).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    if (this->num_cells_ == (long)puVar10 - (long)puVar8 >> 3) {
      return (int)puVar8;
    }
    this_03 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_03,"supercell::init() internal error");
    puVar14 = &std::logic_error::typeinfo;
    pcVar12 = std::logic_error::~logic_error;
  }
  else {
    this_03 = (logic_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              ((invalid_argument *)this_03,"invalid shape of span matrix");
    puVar14 = &std::invalid_argument::typeinfo;
    pcVar12 = std::invalid_argument::~invalid_argument;
  }
  __cxa_throw(this_03,puVar14,pcVar12);
}

Assistant:

void init(const span_t& span) {
    span_ = span;
    if (span_.cols() != span_.rows())
      throw std::invalid_argument("invalid shape of span matrix");
    dim_ = span_.cols();
    num_cells_ = std::size_t(std::abs(span_.cast<double>().determinant()) + 0.5);
    rs_ = span_.cast<double>().inverse();

    nmin_ = offset_t::Zero(dim_);
    nmax_ = offset_t::Zero(dim_);
    for (std::size_t i = 0; i < std::size_t(1 << dim_); ++i) {
      for (std::size_t m = 0; m < dim_; ++m) {
        long v = 0;
        for (std::size_t n = 0; n < dim_; ++n) v += ((i >> n) & 1) * span_(m, n);
        nmin_(m) = std::min(nmin_(m), v);
        nmax_(m) = std::max(nmax_(m), v);
      }
    }
    
    std::size_t lcord_max = 1;
    for (std::size_t m = 0; m < dim_; ++m) lcord_max *= (nmax_(m) - nmin_(m));
    lcord2index_.resize(lcord_max);
    index2lcord_.clear();
    for (std::size_t i = 0; i < lcord2index_.size(); ++i) {
      offset_t c = lcord2offset(i);
      if (within_supercell(c)) {
        lcord2index_[i] = index2lcord_.size();
        index2lcord_.push_back(i);
      }
    }
    if (num_cells_ != index2lcord_.size())
      throw std::logic_error("supercell::init() internal error");
  }